

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O2

void __thiscall gvr::anon_unknown_3::PLYValueList::~PLYValueList(PLYValueList *this)

{
  pointer ppPVar1;
  PLYValue *pPVar2;
  size_t i;
  ulong uVar3;
  
  (this->super_PLYValue)._vptr_PLYValue = (_func_int **)&PTR__PLYValueList_00172f80;
  if (this->size != (PLYValue *)0x0) {
    (*this->size->_vptr_PLYValue[1])();
  }
  uVar3 = 0;
  while( true ) {
    ppPVar1 = (this->list).super__Vector_base<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->list).
                      super__Vector_base<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppPVar1 >> 3) <= uVar3) break;
    pPVar2 = ppPVar1[uVar3];
    if (pPVar2 != (PLYValue *)0x0) {
      (*pPVar2->_vptr_PLYValue[1])();
    }
    uVar3 = uVar3 + 1;
  }
  std::_Vector_base<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>::~_Vector_base
            (&(this->list).super__Vector_base<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>);
  return;
}

Assistant:

~PLYValueList()
    {
      delete size;

      for (size_t i=0; i<list.size(); i++)
      {
        delete list[i];
      }
    }